

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O3

QSet<QGesture_*> __thiscall
QSet<QGesture_*>::intersected_helper
          (QSet<QGesture_*> *this,QSet<QGesture_*> *lhs,QSet<QGesture_*> *rhs)

{
  Span *pSVar1;
  Data *this_00;
  Node<QGesture_*,_QHashDummyValue> *pNVar2;
  ulong uVar3;
  Data *pDVar4;
  ulong uVar5;
  size_t size;
  size_t sVar6;
  size_t sVar7;
  Entry *key;
  long in_FS_OFFSET;
  const_iterator cVar8;
  QHashDummyValue local_41;
  anon_struct_8_1_898a9ca8_for_storage local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->q_hash).d = (Data *)0x0;
  pDVar4 = (lhs->q_hash).d;
  if (pDVar4 == (Data *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = pDVar4->size;
  }
  pDVar4 = (rhs->q_hash).d;
  if (pDVar4 == (Data *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = pDVar4->size;
  }
  size = sVar6;
  if ((long)sVar7 < (long)sVar6) {
    size = sVar7;
  }
  QHash<QGesture_*,_QHashDummyValue>::reserve(&this->q_hash,size);
  if ((long)sVar6 <= (long)sVar7) {
    pDVar4 = (lhs->q_hash).d;
    if (pDVar4 == (Data *)0x0) {
      pDVar4 = (Data *)0x0;
      uVar5 = 0;
LAB_002e01e0:
      if (uVar5 == 0 && pDVar4 == (Data *)0x0) goto LAB_002e028e;
    }
    else {
      if (pDVar4->spans->offsets[0] == 0xff) {
        uVar3 = 1;
        do {
          uVar5 = uVar3;
          if (pDVar4->numBuckets == uVar5) {
            pDVar4 = (Data *)0x0;
            uVar5 = 0;
            break;
          }
          uVar3 = uVar5 + 1;
        } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
        goto LAB_002e01e0;
      }
      uVar5 = 0;
    }
    do {
      this_00 = (rhs->q_hash).d;
      if (this_00 != (Data *)0x0) {
        key = pDVar4->spans[uVar5 >> 7].entries +
              pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f];
        pNVar2 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QHashDummyValue>>::
                 findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QHashDummyValue>> *)this_00,
                                     (QGesture **)key);
        if (pNVar2 != (Node<QGesture_*,_QHashDummyValue> *)0x0) {
          local_40.data = *&(key->storage).data;
          QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                    ((QHash<QGesture*,QHashDummyValue> *)this,(QGesture **)&local_40,&local_41);
        }
      }
      do {
        if (pDVar4->numBuckets - 1 == uVar5) {
          uVar5 = 0;
          pDVar4 = (Data *)0x0;
          break;
        }
        uVar5 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
    } while (uVar5 != 0 || pDVar4 != (Data *)0x0);
    goto LAB_002e028e;
  }
  pDVar4 = (rhs->q_hash).d;
  if (pDVar4 == (Data *)0x0) {
    pDVar4 = (Data *)0x0;
    uVar5 = 0;
LAB_002e0105:
    if (pDVar4 == (Data *)0x0 && uVar5 == 0) goto LAB_002e028e;
  }
  else {
    if (pDVar4->spans->offsets[0] == 0xff) {
      uVar3 = 1;
      do {
        uVar5 = uVar3;
        if (pDVar4->numBuckets == uVar5) {
          pDVar4 = (Data *)0x0;
          uVar5 = 0;
          break;
        }
        uVar3 = uVar5 + 1;
      } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
      goto LAB_002e0105;
    }
    uVar5 = 0;
  }
  do {
    cVar8 = QHash<QGesture*,QHashDummyValue>::constFindImpl<QGesture*>
                      ((QHash<QGesture*,QHashDummyValue> *)lhs,
                       (QGesture **)
                       (pDVar4->spans[uVar5 >> 7].entries +
                       pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f]));
    if (cVar8.i.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 ||
        cVar8.i.bucket != 0) {
      pSVar1 = (cVar8.i.d)->spans;
      uVar3 = cVar8.i.bucket >> 7;
      local_40.data =
           *&pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)cVar8.i.bucket & 0x7f]].storage.data;
      QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                ((QHash<QGesture*,QHashDummyValue> *)this,(QGesture **)&local_40,&local_41);
    }
    do {
      if (pDVar4->numBuckets - 1 == uVar5) {
        pDVar4 = (Data *)0x0;
        uVar5 = 0;
        break;
      }
      uVar5 = uVar5 + 1;
    } while (pDVar4->spans[uVar5 >> 7].offsets[(uint)uVar5 & 0x7f] == 0xff);
  } while ((pDVar4 != (Data *)0x0) || (uVar5 != 0));
LAB_002e028e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSet<QGesture_*>)(Hash)this;
}

Assistant:

auto QSet<T>::intersected_helper(const QSet &lhs, const QSet &rhs) -> QSet
{
    QSet r;

    const auto l_size = lhs.size();
    const auto r_size = rhs.size();
    r.reserve((std::min)(l_size, r_size));

    // Iterate the smaller of the two sets, but always take from lhs, for
    // consistency with insert():

    if (l_size <= r_size) {
        // lhs is not larger
        for (const auto &e : lhs) {
            if (rhs.contains(e))
                r.insert(e);
        }
    } else {
        // rhs is smaller
        for (const auto &e : rhs) {
            if (const auto it = lhs.find(e); it != lhs.end())
                r.insert(*it);
        }
    }

    return r;
}